

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skill.cpp
# Opt level: O0

double __thiscall Skill::getDamageRate(Skill *this)

{
  result_type_conflict rVar1;
  Skill *this_local;
  
  rVar1 = std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::operator()
                    (&gen_rand);
  this->random_num = (int)(rVar1 % 0xe);
  this->damage_rate = 1.0;
  if ((this->random_num == 0) || (this->random_num == 1)) {
    this->damage_rate = 0.9;
  }
  if (((this->random_num == 2) || (this->random_num == 3)) || (this->random_num == 4)) {
    this->damage_rate = 0.95;
  }
  if (((this->random_num == 5) || (this->random_num == 6)) || (this->random_num == 7)) {
    this->damage_rate = 1.05;
  }
  if ((this->random_num == 8) || (this->random_num == 9)) {
    this->damage_rate = 1.1;
  }
  if (this->random_num == 10) {
    this->damage_rate = 1.8;
  }
  return this->damage_rate;
}

Assistant:

double Skill::getDamageRate(){
    random_num=gen_rand()%14;
    damage_rate=1;
    if(random_num==0||random_num==1) {damage_rate=0.9;}
    if(random_num==2||random_num==3||random_num==4) {damage_rate=0.95;}
    if(random_num==5||random_num==6||random_num==7) {damage_rate=1.05;}
    if(random_num==8||random_num==9) {damage_rate=1.1;}
    if(random_num==10) {damage_rate=1.8;}
    return damage_rate;
}